

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderRenderCase.cpp
# Opt level: O2

void __thiscall deqp::QuadGrid::~QuadGrid(QuadGrid *this)

{
  long lVar1;
  
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&(this->m_indices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)
  ;
  lVar1 = 0;
  do {
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              ((_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               ((long)&this->m_userAttribs[3].
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x60);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&(this->m_attribOne).super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&(this->m_unitCoords).
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&(this->m_coords).
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&(this->m_positions).
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&(this->m_screenPos).
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  std::_Vector_base<deqp::TextureBinding,_std::allocator<deqp::TextureBinding>_>::~_Vector_base
            (&(this->m_textures).
              super__Vector_base<deqp::TextureBinding,_std::allocator<deqp::TextureBinding>_>);
  std::_Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
  ~_Vector_base(&(this->m_userAttribTransforms).
                 super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
               );
  return;
}

Assistant:

QuadGrid::~QuadGrid(void)
{
}